

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module_ * __thiscall
pybind11::module_::def<kratos::Const&(*)(long,unsigned_int,bool),pybind11::return_value_policy>
          (module_ *this,char *name_,_func_Const_ptr_long_uint_bool **f,return_value_policy *extra)

{
  _func_Const_ptr_long_uint_bool *f_00;
  handle local_58;
  name local_50;
  scope local_48;
  object local_40;
  handle local_38;
  cpp_function func;
  
  f_00 = *f;
  local_48.value.m_ptr = (handle)(this->super_object).super_handle.m_ptr;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50.value = name_;
  getattr((pybind11 *)&func,local_48.value,name_,(PyObject *)&_Py_NoneStruct);
  local_58.m_ptr = (PyObject *)func.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<kratos::Const&,long,unsigned_int,bool,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::return_value_policy>
            ((cpp_function *)&local_38,f_00,&local_50,&local_48,(sibling *)&local_58,extra);
  object::~object((object *)&func);
  object::~object(&local_40);
  add_object(this,name_,local_38,true);
  object::~object((object *)&local_38);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }